

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Element * __thiscall Rml::Element::GetClosestScrollableContainer(Element *this)

{
  bool bVar1;
  bool bVar2;
  Overflow OVar3;
  Overflow OVar4;
  OverscrollBehavior OVar5;
  float fVar6;
  float fVar7;
  bool scrollable_y;
  bool scrollable_x;
  Overflow overflow_y;
  Overflow overflow_x;
  Element *this_local;
  
  OVar3 = Style::ComputedValues::overflow_x(&this->meta->computed_values);
  OVar4 = Style::ComputedValues::overflow_y(&this->meta->computed_values);
  bVar1 = false;
  if (OVar3 == Auto || OVar3 == Scroll) {
    fVar6 = GetScrollWidth(this);
    fVar7 = GetClientWidth(this);
    bVar1 = fVar7 < fVar6;
  }
  bVar2 = false;
  if (OVar4 == Auto || OVar4 == Scroll) {
    fVar6 = GetScrollHeight(this);
    fVar7 = GetClientHeight(this);
    bVar2 = fVar7 < fVar6;
  }
  this_local = this;
  if (((!bVar1) && (!bVar2)) &&
     (OVar5 = Style::ComputedValues::overscroll_behavior(&this->meta->computed_values),
     OVar5 != Contain)) {
    if (this->parent == (Element *)0x0) {
      this_local = (Element *)0x0;
    }
    else {
      this_local = GetClosestScrollableContainer(this->parent);
    }
  }
  return this_local;
}

Assistant:

Element* Element::GetClosestScrollableContainer()
{
	using namespace Style;

	Overflow overflow_x = meta->computed_values.overflow_x();
	Overflow overflow_y = meta->computed_values.overflow_y();
	bool scrollable_x = (overflow_x == Overflow::Auto || overflow_x == Overflow::Scroll);
	bool scrollable_y = (overflow_y == Overflow::Auto || overflow_y == Overflow::Scroll);

	scrollable_x = (scrollable_x && GetScrollWidth() > GetClientWidth());
	scrollable_y = (scrollable_y && GetScrollHeight() > GetClientHeight());

	if (scrollable_x || scrollable_y || meta->computed_values.overscroll_behavior() == OverscrollBehavior::Contain)
		return this;
	else if (parent)
		return parent->GetClosestScrollableContainer();

	return nullptr;
}